

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O3

size_t __thiscall
Memory::
SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::GetNonEmptyHeapBlockCount
          (SmallNormalHeapBucketBase<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,bool checkCount)

{
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar1;
  undefined4 *puVar2;
  code *pcVar3;
  long lVar4;
  bool bVar5;
  size_t sVar6;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  undefined8 *in_FS_OFFSET;
  
  lVar8 = 0;
  sVar6 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
          GetNonEmptyHeapBlockCount
                    (&this->
                      super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                     ,false);
  pSVar7 = this->partialHeapBlockList;
  if (pSVar7 != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar10 = 1;
    do {
      lVar8 = lVar10;
      pSVar1 = (pSVar7->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar7 = HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
      lVar10 = lVar8 + 1;
    } while (pSVar7 != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  pSVar7 = this->partialSweptHeapBlockList;
  if (pSVar7 == (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar10 = 0;
  }
  else {
    lVar4 = 1;
    do {
      lVar10 = lVar4;
      pSVar1 = (pSVar7->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar7 = HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar1->super_HeapBlock);
      lVar4 = lVar10 + 1;
    } while (pSVar7 != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  uVar9 = lVar8 + sVar6 + lVar10;
  if ((checkCount) &&
     (uVar9 != (this->
               super_HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
               ).super_HeapBucket.heapBlockCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x2d4,
                       "(!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep))"
                       ,
                       "!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)"
                      );
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  return uVar9;
}

Assistant:

size_t
SmallNormalHeapBucketBase<TBlockType>::GetNonEmptyHeapBlockCount(bool checkCount) const
{
    size_t currentHeapBlockCount = __super::GetNonEmptyHeapBlockCount(false);
    currentHeapBlockCount += HeapBlockList::Count(partialHeapBlockList);
#if ENABLE_CONCURRENT_GC
    currentHeapBlockCount += HeapBlockList::Count(partialSweptHeapBlockList);
#endif
    bool allocatingDuringConcurrentSweep = false;

#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
    {
        allocatingDuringConcurrentSweep = true;
    }
#endif
#endif
#endif
    RECYCLER_SLOW_CHECK(Assert(!checkCount || this->heapBlockCount == currentHeapBlockCount || (this->heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)));
    return currentHeapBlockCount;
}